

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.hpp
# Opt level: O0

void __thiscall Shader::Shader(Shader *this,char *vertexPath,char *fragmentPath,char *geometryPath)

{
  undefined8 uVar1;
  GLuint GVar2;
  streambuf *psVar3;
  allocator local_c81;
  string local_c80 [39];
  allocator local_c59;
  string local_c58 [32];
  GLchar *local_c38;
  char *gShaderCode;
  uint geometry;
  allocator local_c01;
  string local_c00 [32];
  GLuint local_be0;
  GLuint local_bdc;
  uint fragment;
  uint vertex;
  char *fShaderCode;
  char *vShaderCode;
  failure e;
  string local_ba8 [32];
  stringstream local_b88 [8];
  stringstream gShaderStream;
  ostream local_b78 [376];
  string local_a00 [32];
  string local_9e0 [32];
  stringstream local_9c0 [8];
  stringstream fShaderStream;
  ostream local_9b0 [376];
  stringstream local_838 [8];
  stringstream vShaderStream;
  ostream local_828 [376];
  long local_6b0;
  ifstream gShaderFile;
  long local_4a8;
  ifstream fShaderFile;
  long local_290;
  ifstream vShaderFile;
  string local_88 [8];
  string geometryCode;
  string local_68 [8];
  string fragmentCode;
  string local_48 [8];
  string vertexCode;
  char *geometryPath_local;
  char *fragmentPath_local;
  char *vertexPath_local;
  Shader *this_local;
  
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::ifstream::ifstream(&local_290);
  std::ifstream::ifstream(&local_4a8);
  std::ifstream::ifstream(&local_6b0);
  uVar1 = *(undefined8 *)(local_290 + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)&local_290 + (int)uVar1);
  uVar1 = *(undefined8 *)(local_4a8 + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)&local_4a8 + (int)uVar1);
  uVar1 = *(undefined8 *)(local_6b0 + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)&local_6b0 + (int)uVar1);
  std::ifstream::open(&local_290,vertexPath,8);
  std::ifstream::open(&local_4a8,fragmentPath,8);
  std::__cxx11::stringstream::stringstream(local_838);
  std::__cxx11::stringstream::stringstream(local_9c0);
  psVar3 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_828,psVar3);
  psVar3 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_9b0,psVar3);
  std::ifstream::close();
  std::ifstream::close();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_48,local_9e0);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_68,local_a00);
  std::__cxx11::string::~string(local_a00);
  if (geometryPath != (char *)0x0) {
    std::ifstream::open(&local_6b0,geometryPath,8);
    std::__cxx11::stringstream::stringstream(local_b88);
    psVar3 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_b78,psVar3);
    std::ifstream::close();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_88,local_ba8);
    std::__cxx11::string::~string(local_ba8);
    std::__cxx11::stringstream::~stringstream(local_b88);
  }
  std::__cxx11::stringstream::~stringstream(local_9c0);
  std::__cxx11::stringstream::~stringstream(local_838);
  fShaderCode = (char *)std::__cxx11::string::c_str();
  _fragment = (GLchar *)std::__cxx11::string::c_str();
  local_bdc = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(local_bdc,1,&fShaderCode,(GLint *)0x0);
  (*glad_glCompileShader)(local_bdc);
  GVar2 = local_bdc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c00,"VERTEX",&local_c01);
  checkCompileErrors(this,GVar2,(string *)local_c00);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  local_be0 = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(local_be0,1,(GLchar **)&fragment,(GLint *)0x0);
  (*glad_glCompileShader)(local_be0);
  GVar2 = local_be0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&geometry,"FRAGMENT",(allocator *)((long)&gShaderCode + 7))
  ;
  checkCompileErrors(this,GVar2,(string *)&geometry);
  std::__cxx11::string::~string((string *)&geometry);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gShaderCode + 7));
  if (geometryPath != (char *)0x0) {
    local_c38 = (GLchar *)std::__cxx11::string::c_str();
    gShaderCode._0_4_ = (*glad_glCreateShader)(0x8dd9);
    (*glad_glShaderSource)((GLuint)gShaderCode,1,&local_c38,(GLint *)0x0);
    (*glad_glCompileShader)((GLuint)gShaderCode);
    GVar2 = (GLuint)gShaderCode;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c58,"GEOMETRY",&local_c59);
    checkCompileErrors(this,GVar2,(string *)local_c58);
    std::__cxx11::string::~string(local_c58);
    std::allocator<char>::~allocator((allocator<char> *)&local_c59);
  }
  GVar2 = (*glad_glCreateProgram)();
  this->ID = GVar2;
  (*glad_glAttachShader)(this->ID,local_bdc);
  (*glad_glAttachShader)(this->ID,local_be0);
  if (geometryPath != (char *)0x0) {
    (*glad_glAttachShader)(this->ID,(GLuint)gShaderCode);
  }
  (*glad_glLinkProgram)(this->ID);
  GVar2 = this->ID;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c80,"PROGRAM",&local_c81);
  checkCompileErrors(this,GVar2,(string *)local_c80);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  (*glad_glDeleteShader)(local_bdc);
  (*glad_glDeleteShader)(local_be0);
  if (geometryPath != (char *)0x0) {
    (*glad_glDeleteShader)((GLuint)gShaderCode);
  }
  std::ifstream::~ifstream(&local_6b0);
  std::ifstream::~ifstream(&local_4a8);
  std::ifstream::~ifstream(&local_290);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

Shader(const char* vertexPath, const char* fragmentPath, const char* geometryPath = nullptr) {
        // 1. retrieve the vertex/fragment source code from filePath
        std::string vertexCode;
        std::string fragmentCode;
        std::string geometryCode;
        std::ifstream vShaderFile;
        std::ifstream fShaderFile;
        std::ifstream gShaderFile;
        // ensure ifstream objects can throw exceptions:
        vShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        fShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        gShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        try {
            // open files
            vShaderFile.open(vertexPath);
            fShaderFile.open(fragmentPath);
            std::stringstream vShaderStream, fShaderStream;
            // read file's buffer contents into streams
            vShaderStream << vShaderFile.rdbuf();
            fShaderStream << fShaderFile.rdbuf();		
            // close file handlers
            vShaderFile.close();
            fShaderFile.close();
            // convert stream into string
            vertexCode = vShaderStream.str();
            fragmentCode = fShaderStream.str();			
            // if geometry shader path is present, also load a geometry shader
            if(geometryPath != nullptr)
            {
                gShaderFile.open(geometryPath);
                std::stringstream gShaderStream;
                gShaderStream << gShaderFile.rdbuf();
                gShaderFile.close();
                geometryCode = gShaderStream.str();
            }
        } catch (std::ifstream::failure e) {
            std::cout << "ERROR::SHADER::FILE_NOT_SUCCESFULLY_READ" << std::endl;
        }
        const char* vShaderCode = vertexCode.c_str();
        const char * fShaderCode = fragmentCode.c_str();
        // 2. compile shaders
        unsigned int vertex, fragment;
        // vertex shader
        vertex = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex, 1, &vShaderCode, NULL);
        glCompileShader(vertex);
        checkCompileErrors(vertex, "VERTEX");
        // fragment Shader
        fragment = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment, 1, &fShaderCode, NULL);
        glCompileShader(fragment);
        checkCompileErrors(fragment, "FRAGMENT");
        // if geometry shader is given, compile geometry shader
        unsigned int geometry;
        if(geometryPath != nullptr) {
            const char * gShaderCode = geometryCode.c_str();
            geometry = glCreateShader(GL_GEOMETRY_SHADER);
            glShaderSource(geometry, 1, &gShaderCode, NULL);
            glCompileShader(geometry);
            checkCompileErrors(geometry, "GEOMETRY");
        }
        // shader Program
        ID = glCreateProgram();
        glAttachShader(ID, vertex);
        glAttachShader(ID, fragment);
        if(geometryPath != nullptr)
            glAttachShader(ID, geometry);
        glLinkProgram(ID);
        checkCompileErrors(ID, "PROGRAM");
        // delete the shaders as they're linked into our program now and no longer necessery
        glDeleteShader(vertex);
        glDeleteShader(fragment);
        if(geometryPath != nullptr)
            glDeleteShader(geometry);

    }